

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  ostream *poVar2;
  string path;
  vector<int,_std::allocator<int>_> keys;
  stat st_1;
  PutDelayTest putDelayTest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2850;
  vector<int,_std::allocator<int>_> local_2830;
  long *local_2818 [2];
  long local_2808 [2];
  long *local_27f8 [2];
  long local_27e8 [2];
  undefined1 local_27d8 [144];
  undefined1 local_2748 [10016];
  
  local_2850._M_dataplus._M_p = (pointer)&local_2850.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2850,"../data","");
  local_27f8[0] = local_27e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_27f8,local_2850._M_dataplus._M_p,
             local_2850._M_dataplus._M_p + local_2850._M_string_length);
  iVar1 = stat((char *)local_27f8[0],(stat *)local_2748);
  if (local_27f8[0] != local_27e8) {
    operator_delete(local_27f8[0],local_27e8[0] + 1);
  }
  if (((byte)((uint)local_2748._24_4_ >> 0xe) & 1 & iVar1 == 0) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748,
                   "rm -rf ",&local_2850);
    system((char *)local_2748._0_8_);
    if ((undefined1 *)local_2748._0_8_ != local_2748 + 0x10) {
      operator_delete((void *)local_2748._0_8_,local_2748._16_8_ + 1);
    }
  }
  std::chrono::_V2::system_clock::now();
  PutDelayTest::PutDelayTest((PutDelayTest *)local_2748,1000,false);
  PutDelayTest::startTest(&local_2830,(PutDelayTest *)local_2748);
  GetDelayTest::startTest(&local_2830);
  DeleteDelayTest::startTest(&local_2830);
  local_2818[0] = local_2808;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2818,local_2850._M_dataplus._M_p,
             local_2850._M_dataplus._M_p + local_2850._M_string_length);
  iVar1 = stat((char *)local_2818[0],(stat *)local_27d8);
  if (local_2818[0] != local_2808) {
    operator_delete(local_2818[0],local_2808[0] + 1);
  }
  if (((byte)((uint)local_27d8._24_4_ >> 0xe) & 1 & iVar1 == 0) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_27d8,
                   "rm -rf ",&local_2850);
    system((char *)local_27d8._0_8_);
    if ((undefined1 *)local_27d8._0_8_ != local_27d8 + 0x10) {
      operator_delete((void *)local_27d8._0_8_,local_27d8._16_8_ + 1);
    }
  }
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,">>>>> Summary <<<<<",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"It takes ",9);
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"s to complete the test.",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_2830.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2830.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2830.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2830.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2850._M_dataplus._M_p != &local_2850.field_2) {
    operator_delete(local_2850._M_dataplus._M_p,local_2850.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main() {
  string path = "../data";
  if (utils::dirExists(path)) {
    string cmd = "rm -rf " + path;
    system(cmd.c_str());
  }

  auto start = high_resolution_clock::now();
  PutDelayTest putDelayTest(1000, false);
  auto keys = putDelayTest.startTest();

  GetDelayTest::startTest(keys);
  DeleteDelayTest::startTest(keys);

  if (utils::dirExists(path)) {
    string cmd = "rm -rf " + path;
    system(cmd.c_str());
  }

  auto end = high_resolution_clock::now();
  auto totalTime = duration_cast<seconds>(end - start).count();

  cout << ">>>>> Summary <<<<<" << endl;
  cout << "It takes " << totalTime << "s to complete the test." << endl;
}